

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsNetId.cpp
# Opt level: O3

void __thiscall AmsNetId::AmsNetId(AmsNetId *this,string *addr)

{
  int iVar1;
  istream *piVar2;
  long lVar3;
  string s;
  istringstream iss;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8 [16];
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)addr,_S_in);
  local_1c0 = 0;
  local_1b8[0] = '\0';
  lVar3 = 0;
  local_1c8 = local_1b8;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_0012ad45;
    iVar1 = atoi(local_1c8);
    this->b[lVar3] = (uint8_t)iVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_1a8,(string *)&local_1c8,'.');
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
LAB_0012ad45:
    if (AmsNetId(std::__cxx11::string_const&)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&AmsNetId(std::__cxx11::string_const&)::empty);
      if (iVar1 != 0) {
        AmsNetId(&AmsNetId::empty,0);
        __cxa_guard_release(&AmsNetId(std::__cxx11::string_const&)::empty);
      }
    }
    *(undefined2 *)(this->b + 4) = AmsNetId::empty.b._4_2_;
    *(undefined4 *)this->b = AmsNetId::empty.b._0_4_;
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

AmsNetId::AmsNetId(const std::string& addr)
{
    std::istringstream iss(addr);
    std::string s;
    size_t i = 0;

    while ((i < sizeof(b)) && std::getline(iss, s, '.')) {
        b[i] = atoi(s.c_str()) % 256;
        ++i;
    }

    if ((i != sizeof(b)) || std::getline(iss, s, '.')) {
        static const AmsNetId empty {};
        memcpy(b, empty.b, sizeof(b));
    }
}